

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# input.c
# Opt level: O1

GLFWcursor * glfwCreateCursor(GLFWimage *image,int xhot,int yhot)

{
  int iVar1;
  _GLFWcursor *cursor;
  
  if (_glfwInitialized == '\0') {
    cursor = (_GLFWcursor *)0x0;
    _glfwInputError(0x10001,(char *)0x0);
  }
  else {
    cursor = (_GLFWcursor *)calloc(1,0x10);
    cursor->next = _glfw.cursorListHead;
    _glfw.cursorListHead = cursor;
    iVar1 = _glfwPlatformCreateCursor(cursor,image,xhot,yhot);
    if (iVar1 == 0) {
      glfwDestroyCursor((GLFWcursor *)cursor);
      cursor = (_GLFWcursor *)0x0;
    }
  }
  return (GLFWcursor *)cursor;
}

Assistant:

GLFWAPI GLFWcursor* glfwCreateCursor(const GLFWimage* image, int xhot, int yhot)
{
    _GLFWcursor* cursor;

    _GLFW_REQUIRE_INIT_OR_RETURN(NULL);

    cursor = calloc(1, sizeof(_GLFWcursor));
    cursor->next = _glfw.cursorListHead;
    _glfw.cursorListHead = cursor;

    if (!_glfwPlatformCreateCursor(cursor, image, xhot, yhot))
    {
        glfwDestroyCursor((GLFWcursor*) cursor);
        return NULL;
    }

    return (GLFWcursor*) cursor;
}